

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O2

void __thiscall
directed_flag_complex_t::do_for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
          (directed_flag_complex_t *this,add_cell_index_to_cache_t *f,int min_dimension,
          int max_dimension,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *possible_next_vertices,
          vertex_index_t *prefix,unsigned_short prefix_size)

{
  vertex_index_t *pvVar1;
  ulong uVar2;
  bool bVar3;
  undefined4 in_register_0000000c;
  vertex_index_t *pvVar4;
  size_t offset;
  ulong uVar5;
  unsigned_long uVar6;
  unsigned_short v;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> new_possible_vertices;
  vertex_index_t local_9a;
  directed_flag_complex_t *local_98;
  ulong local_90;
  uint local_88;
  int local_84;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_80;
  add_cell_index_to_cache_t *local_78;
  undefined8 local_70;
  ulong local_68;
  vertex_index_t *local_60;
  ushort *local_58;
  ushort *local_50;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  local_70 = CONCAT44(in_register_0000000c,max_dimension);
  local_98 = this;
  local_84 = min_dimension;
  local_80 = possible_next_vertices;
  local_78 = f;
  if (min_dimension < (int)(uint)prefix_size) {
    directed_flag_complex_computer::add_cell_index_to_cache_t::operator()
              (f,prefix,(uint)prefix_size);
  }
  if ((int)local_70 + 1U != (uint)prefix_size) {
    local_58 = (local_80->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    local_88 = prefix_size + 1 & 0xffff;
    local_68 = (ulong)prefix_size;
    local_60 = prefix;
    for (local_50 = (local_80->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                    _M_impl.super__Vector_impl_data._M_start; local_50 != local_58;
        local_50 = local_50 + 1) {
      local_90 = (ulong)*local_50;
      prefix[local_68] = *local_50;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (prefix_size == 0) {
        uVar5 = 0;
        while( true ) {
          uVar2 = (local_98->graph->super_directed_graph_t).incidence_row_length;
          if (uVar2 <= uVar5) break;
          for (uVar6 = (local_98->graph->super_directed_graph_t).incidence_outgoing.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar2 * local_90 + uVar5]; uVar6 != 0;
              uVar6 = uVar6 & ~(1L << (uVar2 & 0x3f))) {
            uVar2 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
              }
            }
            local_9a = (ushort)uVar2 | (ushort)(uVar5 << 6);
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            emplace_back<unsigned_short>
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,
                       &local_9a);
          }
          uVar5 = uVar5 + 1;
        }
      }
      else {
        pvVar1 = (local_80->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pvVar4 = (local_80->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                      )._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar1;
            pvVar4 = pvVar4 + 1) {
          local_9a = *pvVar4;
          if ((vertex_index_t)local_90 != local_9a) {
            bVar3 = directed_graph_t::is_connected_by_an_edge
                              (&local_98->graph->super_directed_graph_t,(vertex_index_t)local_90,
                               local_9a);
            if (bVar3) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,
                         &local_9a);
            }
          }
        }
      }
      prefix = local_60;
      do_for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
                (local_98,local_78,local_84,(int)local_70,
                 (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,local_60,
                 (unsigned_short)local_88);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
    }
  }
  return;
}

Assistant:

void do_for_each_cell(Func& f, int min_dimension, int max_dimension,
	                      const std::vector<vertex_index_t>& possible_next_vertices, vertex_index_t* prefix,
	                      unsigned short prefix_size = 0) {
		// As soon as we have the correct dimension, execute f
		if (prefix_size >= min_dimension + 1) { f(prefix, prefix_size); }

		// If this is the last dimension we are interested in, exit this branch
		if (prefix_size == max_dimension + 1) return;

		for (auto vertex : possible_next_vertices) {
			// We can write the cell given by taking the current vertex as the maximal element
			prefix[prefix_size] = vertex;

			// And compute the next elements
			std::vector<vertex_index_t> new_possible_vertices;
			if (prefix_size > 0) {
				for (auto v : possible_next_vertices) {
					if (vertex != v && graph.is_connected_by_an_edge(vertex, v)) new_possible_vertices.push_back(v);
				}
			} else {
				// Get outgoing vertices of v in chunks of 64
				for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
					size_t bits = graph.get_outgoing_chunk(vertex, offset);

					size_t vertex_offset = offset << 6;
					while (bits > 0) {
						// Get the least significant non-zero bit
						auto b = __builtin_ctzl(bits);

						// Unset this bit
						bits &= ~(ONE_ << b);

						new_possible_vertices.push_back(vertex_index_t(vertex_offset + b));
					}
				}
			}

			do_for_each_cell(f, min_dimension, max_dimension, new_possible_vertices, prefix, prefix_size + 1);
		}
	}